

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O1

void __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::clear
          (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *this)

{
  RefBuilderBase *pRVar1;
  size_t sVar2;
  BuildRef *ptr;
  MemoryMonitorInterface *pMVar3;
  pointer ppBVar4;
  pointer puVar5;
  ulong uVar6;
  
  ppBVar4 = (this->bvh->objects).
            super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->bvh->objects).super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppBVar4) {
    uVar6 = 0;
    do {
      if (ppBVar4[uVar6] != (BVHN<4> *)0x0) {
        (*(ppBVar4[uVar6]->super_AccelData).super_RefCount._vptr_RefCount[5])();
      }
      uVar6 = uVar6 + 1;
      ppBVar4 = (this->bvh->objects).
                super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->bvh->objects).
                                   super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar4 >> 3))
    ;
  }
  puVar5 = (this->builders).
           super__Vector_base<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>,_std::allocator<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->builders).
      super__Vector_base<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>,_std::allocator<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar5) {
    uVar6 = 0;
    do {
      pRVar1 = puVar5[uVar6]._M_t.
               super___uniq_ptr_impl<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
               .
               super__Head_base<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_false>
               ._M_head_impl;
      if (pRVar1 != (RefBuilderBase *)0x0) {
        puVar5[uVar6]._M_t.
        super___uniq_ptr_impl<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
        .
        super__Head_base<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_false>
        ._M_head_impl = (RefBuilderBase *)0x0;
        (*pRVar1->_vptr_RefBuilderBase[1])();
      }
      uVar6 = uVar6 + 1;
      puVar5 = (this->builders).
               super__Vector_base<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>,_std::allocator<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->builders).
                                   super__Vector_base<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>,_std::allocator<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3));
  }
  sVar2 = (this->refs).size_alloced;
  ptr = (this->refs).items;
  if (ptr != (BuildRef *)0x0) {
    if (sVar2 << 6 < 0x1c00000) {
      alignedFree(ptr);
    }
    else {
      os_free(ptr,sVar2 << 6,(this->refs).alloc.hugepages);
    }
  }
  if (sVar2 != 0) {
    pMVar3 = (this->refs).alloc.device;
    (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,sVar2 * -0x40,1);
  }
  (this->refs).size_active = 0;
  (this->refs).size_alloced = 0;
  (this->refs).items = (BuildRef *)0x0;
  return;
}

Assistant:

void BVHNBuilderTwoLevel<N,Mesh,Primitive>::clear()
    {
      for (size_t i=0; i<bvh->objects.size(); i++) 
        if (bvh->objects[i]) bvh->objects[i]->clear();

      for (size_t i=0; i<builders.size(); i++) 
        if (builders[i]) builders[i].reset();

      refs.clear();
    }